

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

Aig_Obj_t * Saig_BmcIntervalConstruct_rec(Saig_Bmc_t *p,Aig_Obj_t *pObj,int i,Vec_Int_t *vVisited)

{
  Aig_Man_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Saig_Bmc_t *local_38;
  Aig_Obj_t *pRes;
  Vec_Int_t *vVisited_local;
  int i_local;
  Aig_Obj_t *pObj_local;
  Saig_Bmc_t *p_local;
  
  p_local = (Saig_Bmc_t *)Saig_BmcObjFrame(p,pObj,i);
  if (p_local == (Saig_Bmc_t *)0x0) {
    iVar1 = Saig_ObjIsPi(p->pAig,pObj);
    if (iVar1 == 0) {
      iVar1 = Saig_ObjIsLo(p->pAig,pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsCo(pObj);
        if (iVar1 == 0) {
          pAVar2 = Aig_ObjFanin0(pObj);
          Saig_BmcIntervalConstruct_rec(p,pAVar2,i,vVisited);
          pAVar2 = Saig_BmcObjChild0(p,pObj,i);
          pAVar3 = Aig_ManConst0(p->pFrm);
          if (pAVar2 == pAVar3) {
            local_38 = (Saig_Bmc_t *)Aig_ManConst0(p->pFrm);
          }
          else {
            pAVar2 = Aig_ObjFanin1(pObj);
            Saig_BmcIntervalConstruct_rec(p,pAVar2,i,vVisited);
            p_00 = p->pFrm;
            pAVar2 = Saig_BmcObjChild0(p,pObj,i);
            pAVar3 = Saig_BmcObjChild1(p,pObj,i);
            local_38 = (Saig_Bmc_t *)Aig_And(p_00,pAVar2,pAVar3);
          }
        }
        else {
          pAVar2 = Aig_ObjFanin0(pObj);
          Saig_BmcIntervalConstruct_rec(p,pAVar2,i,vVisited);
          local_38 = (Saig_Bmc_t *)Saig_BmcObjChild0(p,pObj,i);
        }
      }
      else {
        pAVar2 = Saig_ObjLoToLi(p->pAig,pObj);
        local_38 = (Saig_Bmc_t *)Saig_BmcIntervalConstruct_rec(p,pAVar2,i + -1,vVisited);
      }
    }
    else {
      local_38 = (Saig_Bmc_t *)Aig_ObjCreateCi(p->pFrm);
    }
    if (local_38 == (Saig_Bmc_t *)0x0) {
      __assert_fail("pRes != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                    ,0x1c4,
                    "Aig_Obj_t *Saig_BmcIntervalConstruct_rec(Saig_Bmc_t *, Aig_Obj_t *, int, Vec_Int_t *)"
                   );
    }
    Saig_BmcObjSetFrame(p,pObj,i,(Aig_Obj_t *)local_38);
    iVar1 = Aig_ObjId(pObj);
    Vec_IntPush(vVisited,iVar1);
    Vec_IntPush(vVisited,i);
    p_local = local_38;
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Saig_BmcIntervalConstruct_rec( Saig_Bmc_t * p, Aig_Obj_t * pObj, int i, Vec_Int_t * vVisited )
{
    Aig_Obj_t * pRes;
    pRes = Saig_BmcObjFrame( p, pObj, i );
    if ( pRes != NULL )
        return pRes;
    if ( Saig_ObjIsPi( p->pAig, pObj ) )
        pRes = Aig_ObjCreateCi(p->pFrm);
    else if ( Saig_ObjIsLo( p->pAig, pObj ) )
        pRes = Saig_BmcIntervalConstruct_rec( p, Saig_ObjLoToLi(p->pAig, pObj), i-1, vVisited );
    else if ( Aig_ObjIsCo( pObj ) )
    {
        Saig_BmcIntervalConstruct_rec( p, Aig_ObjFanin0(pObj), i, vVisited );
        pRes = Saig_BmcObjChild0( p, pObj, i );
    }
    else 
    {
        Saig_BmcIntervalConstruct_rec( p, Aig_ObjFanin0(pObj), i, vVisited );
        if ( Saig_BmcObjChild0(p, pObj, i) == Aig_ManConst0(p->pFrm) )
            pRes = Aig_ManConst0(p->pFrm);
        else
        {
            Saig_BmcIntervalConstruct_rec( p, Aig_ObjFanin1(pObj), i, vVisited );
            pRes = Aig_And( p->pFrm, Saig_BmcObjChild0(p, pObj, i), Saig_BmcObjChild1(p, pObj, i) );
        }
    }
    assert( pRes != NULL );
    Saig_BmcObjSetFrame( p, pObj, i, pRes );
    Vec_IntPush( vVisited, Aig_ObjId(pObj) );
    Vec_IntPush( vVisited, i );
    return pRes;
}